

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face_from_indices.h
# Opt level: O1

Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
* __thiscall
Gudhi::coxeter_triangulation::
face_from_indices<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           *__return_storage_ptr__,coxeter_triangulation *this,
          Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *simplex,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  OrderedSetPartition *this_00;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar1;
  int *piVar2;
  uint uVar3;
  pointer piVar4;
  unsigned_long *puVar5;
  iterator iVar6;
  pointer pvVar7;
  pointer puVar8;
  pointer puVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *part;
  pointer pvVar10;
  unsigned_long *puVar11;
  unsigned_long uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  part_index j;
  unsigned_long local_68;
  ulong local_60;
  coxeter_triangulation *local_58;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = *(long *)this;
  local_48 = *(long *)(this + 8);
  local_58 = this;
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->vertex_,(vector<int,_std::allocator<int>_> *)this);
  uVar14 = (long)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  this_00 = &__return_storage_ptr__->partition_;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_00,uVar14);
  local_38 = *(long *)(local_58 + 0x20) - *(long *)(local_58 + 0x18);
  local_60 = uVar14;
  local_50 = simplex;
  if (1 < uVar14) {
    uVar14 = 1;
    do {
      piVar4 = (simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = piVar4[uVar14 - 1];
      uVar13 = (ulong)uVar3;
      if (uVar3 < (uint)piVar4[uVar14]) {
        do {
          puVar5 = *(unsigned_long **)(*(long *)(local_58 + 0x18) + 8 + uVar13 * 0x18);
          for (puVar11 = *(unsigned_long **)(*(long *)(local_58 + 0x18) + uVar13 * 0x18);
              puVar11 != puVar5; puVar11 = puVar11 + 1) {
            local_68 = *puVar11;
            pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                     ((this_00->
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (uVar14 - 1));
            iVar6._M_current = *(unsigned_long **)(pvVar1 + 8);
            if (iVar6._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar6,&local_68);
            }
            else {
              *iVar6._M_current = local_68;
              *(unsigned_long **)(pvVar1 + 8) = iVar6._M_current + 1;
            }
          }
          uVar13 = uVar13 + 1;
          simplex = local_50;
        } while (uVar13 < (uint)(local_50->vertex_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar14]);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_60);
  }
  uVar14 = (local_38 >> 3) * -0x5555555555555555;
  uVar13 = (ulong)(uint)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[local_60 - 1];
  lVar15 = local_60 - 1;
  local_60 = lVar15;
  if (uVar13 <= uVar14 && uVar14 - uVar13 != 0) {
    do {
      puVar5 = *(unsigned_long **)(*(long *)(local_58 + 0x18) + 8 + uVar13 * 0x18);
      for (puVar11 = *(unsigned_long **)(*(long *)(local_58 + 0x18) + uVar13 * 0x18);
          puVar11 != puVar5; puVar11 = puVar11 + 1) {
        local_68 = *puVar11;
        pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                 ((this_00->
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar15);
        iVar6._M_current = *(unsigned_long **)(pvVar1 + 8);
        if (iVar6._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar6,&local_68);
        }
        else {
          *iVar6._M_current = local_68;
          *(unsigned_long **)(pvVar1 + 8) = iVar6._M_current + 1;
        }
      }
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (uVar13 < uVar14);
  }
  uVar14 = local_60;
  if (*(local_50->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start != 0) {
    uVar12 = local_48 - local_40 >> 2;
    uVar13 = 0;
    do {
      puVar5 = *(unsigned_long **)(*(long *)(local_58 + 0x18) + 8 + uVar13 * 0x18);
      for (puVar11 = *(unsigned_long **)(*(long *)(local_58 + 0x18) + uVar13 * 0x18);
          puVar11 != puVar5; puVar11 = puVar11 + 1) {
        local_68 = *puVar11;
        if (local_68 == uVar12) {
          if (local_48 != local_40) {
            piVar4 = (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar15 = 0;
            do {
              piVar2 = piVar4 + lVar15;
              *piVar2 = *piVar2 + -1;
              lVar15 = lVar15 + 1;
            } while (uVar12 + (uVar12 == 0) != lVar15);
          }
        }
        else {
          piVar2 = (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start + local_68;
          *piVar2 = *piVar2 + 1;
        }
        pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                 ((this_00->
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar14);
        iVar6._M_current = *(unsigned_long **)(pvVar1 + 8);
        if (iVar6._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar6,&local_68);
        }
        else {
          *iVar6._M_current = local_68;
          *(unsigned_long **)(pvVar1 + 8) = iVar6._M_current + 1;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (uint)*(local_50->vertex_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  }
  pvVar7 = (__return_storage_ptr__->partition_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar10 = (__return_storage_ptr__->partition_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar10 != pvVar7; pvVar10 = pvVar10 + 1
      ) {
    puVar8 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar9 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar8 != puVar9) {
      uVar14 = (long)puVar9 - (long)puVar8 >> 3;
      lVar15 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar8,puVar9,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar8,puVar9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Permutahedral_representation face_from_indices(const Permutahedral_representation& simplex,
                                               const Index_range& indices) {
  using range_index = typename Index_range::value_type;
  using Ordered_set_partition = typename Permutahedral_representation::OrderedSetPartition;
  using Part = typename Ordered_set_partition::value_type;
  using part_index = typename Part::value_type;
  Permutahedral_representation value;
  std::size_t d = simplex.vertex().size();
  value.vertex() = simplex.vertex();
  std::size_t k = indices.size() - 1;
  value.partition().resize(k + 1);
  std::size_t l = simplex.partition().size() - 1;
  for (std::size_t h = 1; h < k + 1; h++)
    for (range_index i = indices[h - 1]; i < indices[h]; i++)
      for (part_index j : simplex.partition()[i]) value.partition()[h - 1].push_back(j);
  for (range_index i = indices[k]; i < l + 1; i++)
    for (part_index j : simplex.partition()[i]) value.partition()[k].push_back(j);
  for (range_index i = 0; i < indices[0]; i++)
    for (part_index j : simplex.partition()[i]) {
      if (j != d)
        value.vertex()[j]++;
      else
        for (std::size_t l = 0; l < d; l++) value.vertex()[l]--;
      value.partition()[k].push_back(j);
    }
  // sort the values in each part (probably not needed)
  for (auto& part : value.partition()) std::sort(part.begin(), part.end());
  return value;
}